

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiInputTextState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  unsigned_short *puVar4;
  bool bVar5;
  ImWchar *text;
  int new_text_len_utf8;
  int text_len;
  bool is_resizable;
  int new_text_len_local;
  ImWchar *new_text_local;
  int pos_local;
  ImGuiInputTextState *obj_local;
  
  bVar5 = (obj->UserFlags & 0x40000U) != 0;
  iVar1 = obj->CurLenW;
  if (iVar1 < pos) {
    __assert_fail("pos <= text_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                  ,0xe00,
                  "bool ImStb::STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState *, int, const ImWchar *, int)"
                 );
  }
  iVar2 = ImTextCountUtf8BytesFromStr(new_text,new_text + new_text_len);
  if ((bVar5) || (iVar2 + obj->CurLenA + 1 <= obj->BufCapacityA)) {
    if ((obj->TextW).Size < new_text_len + iVar1 + 1) {
      if (!bVar5) {
        return false;
      }
      if ((obj->TextW).Size <= iVar1) {
        __assert_fail("text_len < obj->TextW.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                      ,0xe0b,
                      "bool ImStb::STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState *, int, const ImWchar *, int)"
                     );
      }
      iVar3 = ImMax<int>(0x100,new_text_len);
      iVar3 = ImClamp<int>(new_text_len << 2,0x20,iVar3);
      ImVector<unsigned_short>::resize(&obj->TextW,iVar1 + iVar3 + 1);
    }
    puVar4 = (obj->TextW).Data;
    if (pos != iVar1) {
      memmove(puVar4 + (long)pos + (long)new_text_len,puVar4 + pos,(long)(iVar1 - pos) << 1);
    }
    memcpy(puVar4 + pos,new_text,(long)new_text_len << 1);
    obj->Edited = true;
    obj->CurLenW = new_text_len + obj->CurLenW;
    obj->CurLenA = iVar2 + obj->CurLenA;
    puVar4 = ImVector<unsigned_short>::operator[](&obj->TextW,obj->CurLenW);
    *puVar4 = 0;
    obj_local._7_1_ = true;
  }
  else {
    obj_local._7_1_ = false;
  }
  return obj_local._7_1_;
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(STB_TEXTEDIT_STRING* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const bool is_resizable = (obj->UserFlags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (!is_resizable && (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufCapacityA))
        return false;

    // Grow internal buffer if needed
    if (new_text_len + text_len + 1 > obj->TextW.Size)
    {
        if (!is_resizable)
            return false;
        IM_ASSERT(text_len < obj->TextW.Size);
        obj->TextW.resize(text_len + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1);
    }

    ImWchar* text = obj->TextW.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->Edited = true;
    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->TextW[obj->CurLenW] = '\0';

    return true;
}